

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockPluginTest.cpp
# Opt level: O0

void __thiscall
TEST_GROUP_CppUTestGroupMockPlugin::teardown(TEST_GROUP_CppUTestGroupMockPlugin *this)

{
  MockSupport *pMVar1;
  SimpleString local_40 [2];
  SimpleString local_20;
  TEST_GROUP_CppUTestGroupMockPlugin *local_10;
  TEST_GROUP_CppUTestGroupMockPlugin *this_local;
  
  local_10 = this;
  if (this->test != (UtestShell *)0x0) {
    (*this->test->_vptr_UtestShell[1])();
  }
  if (this->result != (TestResult *)0x0) {
    (*this->result->_vptr_TestResult[1])();
  }
  SimpleString::SimpleString(&local_20,"");
  pMVar1 = mock(&local_20,(MockFailureReporter *)0x0);
  (*pMVar1->_vptr_MockSupport[0x27])();
  SimpleString::~SimpleString(&local_20);
  SimpleString::SimpleString(local_40,"");
  pMVar1 = mock(local_40,(MockFailureReporter *)0x0);
  (*pMVar1->_vptr_MockSupport[0x2f])();
  SimpleString::~SimpleString(local_40);
  return;
}

Assistant:

void teardown() _override
    {
        delete test;
        delete result;
        mock().clear();
        mock().removeAllComparatorsAndCopiers();
    }